

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O0

bool __thiscall
rapidjson::
Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::WriteInt64(Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
             *this,int64_t i64)

{
  char *pcVar1;
  BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *in_RDI;
  char *p;
  char *end;
  char buffer [21];
  undefined7 in_stack_ffffffffffffffb8;
  Ch in_stack_ffffffffffffffbf;
  char *local_38;
  char local_28 [40];
  
  pcVar1 = internal::i64toa((int64_t)in_RDI,
                            (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  PutReserve<rapidjson::BasicOStreamWrapper<std::ostream>>
            ((BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)
             in_RDI->stream_,(long)pcVar1 - (long)local_28);
  for (local_38 = local_28; local_38 != pcVar1; local_38 = local_38 + 1) {
    PutUnsafe<rapidjson::BasicOStreamWrapper<std::ostream>>(in_RDI,in_stack_ffffffffffffffbf);
  }
  return true;
}

Assistant:

bool WriteInt64(int64_t i64) {
        char buffer[21];
        const char* end = internal::i64toa(i64, buffer);
        PutReserve(*os_, static_cast<size_t>(end - buffer));
        for (const char* p = buffer; p != end; ++p)
            PutUnsafe(*os_, static_cast<typename OutputStream::Ch>(*p));
        return true;
    }